

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_SpawnMissileZAimed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double z;
  PClassActor *type;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  AActor *pAVar4;
  PClassActor *pPVar5;
  char *pcVar6;
  AActor *dest;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar4 = (AActor *)(param->field_0).field_1.a;
      if (pAVar4 != (AActor *)0x0) {
        if ((pAVar4->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
          (pAVar4->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar7) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar7 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00431471;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar6 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((z = param[1].field_0.f, param[2].field_0.field_1.atag == 1 ||
                (param[2].field_0.field_1.a == (void *)0x0)))) {
              dest = (AActor *)param[2].field_0.field_1.a;
              if (dest == (AActor *)0x0) {
                NullParam("\"dest\"");
                dest = (AActor *)param[2].field_0.field_1.a;
              }
              pPVar1 = AActor::RegistrationInfo.MyClass;
              if (dest != (AActor *)0x0) {
                if ((dest->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                  iVar2 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
                  (dest->super_DThinker).super_DObject.Class =
                       (PClass *)CONCAT44(extraout_var_00,iVar2);
                }
                pPVar3 = (dest->super_DThinker).super_DObject.Class;
                bVar7 = pPVar3 != (PClass *)0x0;
                if (pPVar3 != pPVar1 && bVar7) {
                  do {
                    pPVar3 = pPVar3->ParentClass;
                    bVar7 = pPVar3 != (PClass *)0x0;
                    if (pPVar3 == pPVar1) break;
                  } while (pPVar3 != (PClass *)0x0);
                }
                if (!bVar7) {
                  pcVar6 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
                  goto LAB_00431490;
                }
              }
              if (numparam == 3) {
                pcVar6 = "(paramnum) < numparam";
              }
              else {
                if ((param[3].field_0.field_3.Type == '\x03') &&
                   ((param[3].field_0.field_1.atag == 1 ||
                    (param[3].field_0.field_1.a == (void *)0x0)))) {
                  type = (PClassActor *)param[3].field_0.field_1.a;
                  if ((type != (PClassActor *)0x0) &&
                     (pPVar5 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
                    do {
                      pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
                      if (pPVar5 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
                    } while (pPVar5 != (PClassActor *)0x0);
                    if (pPVar5 == (PClassActor *)0x0) {
                      pcVar6 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
                      goto LAB_004314ce;
                    }
                  }
                  pAVar4 = P_SpawnMissileZAimed(pAVar4,z,dest,type);
                  if (numret < 1) {
                    iVar2 = 0;
                  }
                  else {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                    ,0x19f1,
                                    "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    iVar2 = 1;
                    VMReturn::SetPointer(ret,pAVar4,1);
                  }
                  return iVar2;
                }
                pcVar6 = 
                "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ;
              }
LAB_004314ce:
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x19f0,
                            "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar6 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_00431490:
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x19ef,
                        "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x19ee,
                    "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00431471:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x19ed,
                "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileZAimed)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileZAimed(self, z, dest, type));
}